

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O3

reg_object fitOCSB(double *x,int N,int f,int lag,int mlags)

{
  size_t __size;
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int N_00;
  double *oup;
  double *oup_00;
  double *__ptr;
  double *x_00;
  double *pdVar6;
  double *pdVar7;
  reg_object obj;
  double *__ptr_00;
  double *pdVar8;
  void *__src;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  reg_object obj_00;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  size_t __size_00;
  long lVar17;
  long lVar18;
  size_t __size_01;
  uint uVar19;
  uint uVar20;
  long lVar21;
  double dStack_108;
  double var [2];
  int local_4c;
  int iStack_48;
  int ylcols;
  double *local_40;
  uint local_34 [2];
  int ylrows;
  
  local_40 = (double *)CONCAT44(local_40._4_4_,lag);
  __size = (long)N * 8;
  oup = (double *)malloc(__size);
  oup_00 = (double *)malloc(__size);
  dStack_108 = 0.0;
  var[0] = 0.0;
  iVar3 = diffs(x,N,1,f,oup);
  _iStack_48 = (double *)CONCAT44(ylcols,iVar3);
  iVar4 = diff(oup,iVar3,1,oup_00);
  __ptr = genLags(oup_00,iVar4,(int)local_40,(int *)local_34,&local_4c);
  uVar2 = local_34[0];
  iVar5 = 0;
  if (-1 < mlags) {
    iVar5 = mlags;
  }
  iVar4 = iVar4 - iVar5;
  lVar17 = (long)(int)local_34[0];
  lVar15 = (long)iVar4;
  __size_00 = lVar17 * lVar15 * 8;
  var[1] = (double)oup_00;
  x_00 = (double *)malloc(__size_00);
  if (0 < lVar17) {
    lVar21 = (long)local_4c;
    pdVar6 = x_00;
    lVar18 = lVar17;
    pdVar7 = __ptr;
    do {
      memcpy(pdVar6,pdVar7,lVar15 * 8);
      pdVar7 = pdVar7 + lVar21;
      pdVar6 = pdVar6 + lVar15;
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
  }
  __size_01 = lVar15 * 8;
  iVar5 = uVar2 + 1;
  pdVar6 = (double *)malloc((long)iVar5 * (long)iVar5 * 8);
  pdVar7 = (double *)malloc(__size_01);
  obj = reg_init(iVar4,iVar5);
  regress(obj,x_00,oup_00 + (uint)mlags,pdVar7,pdVar6,0.95);
  lVar18 = (long)(int)local_40;
  uVar19 = iVar3 - (int)local_40;
  __ptr_00 = genLags(oup,iStack_48,(int)local_40,(int *)local_34,&local_4c);
  lVar21 = (long)local_4c;
  pdVar8 = (double *)malloc(lVar21 * 8);
  __src = malloc((long)(int)uVar19 * 8);
  uVar20 = local_34[0];
  if (0 < (int)uVar19) {
    _iStack_48 = oup + lVar18;
    uVar14 = (ulong)local_34[0];
    uVar16 = 0;
    pdVar9 = __ptr_00;
    do {
      if (0 < (int)uVar20) {
        uVar13 = 0;
        pdVar10 = pdVar9;
        do {
          pdVar8[uVar13] = *pdVar10;
          uVar13 = uVar13 + 1;
          pdVar10 = pdVar10 + lVar21;
        } while (uVar14 != uVar13);
      }
      dVar1 = fitted(obj,pdVar8,pdVar6,&dStack_108);
      *(double *)((long)__src + uVar16 * 8) = _iStack_48[uVar16] - dVar1;
      uVar16 = uVar16 + 1;
      pdVar9 = pdVar9 + 1;
    } while (uVar16 != uVar19);
  }
  free(pdVar8);
  pdVar8 = (double *)malloc(__size);
  N_00 = diff(x,N,1,pdVar8);
  iVar3 = (int)local_40;
  pdVar9 = genLags(pdVar8,N_00,(int)local_40,(int *)local_34,&local_4c);
  uVar20 = N_00 - iVar3;
  pdVar10 = (double *)malloc((long)local_4c * 8);
  _iStack_48 = (double *)malloc((long)(int)uVar20 * 8);
  if (0 < (int)uVar20) {
    local_40 = (double *)(ulong)uVar20;
    uVar16 = 0;
    pdVar12 = pdVar9;
    do {
      if (0 < (int)local_34[0]) {
        uVar14 = 0;
        pdVar11 = pdVar12;
        do {
          pdVar10[uVar14] = *pdVar11;
          uVar14 = uVar14 + 1;
          pdVar11 = pdVar11 + local_4c;
        } while (local_34[0] != uVar14);
      }
      dVar1 = fitted(obj,pdVar10,pdVar6,&dStack_108);
      *(double *)((long)_iStack_48 + uVar16 * 8) = pdVar8[lVar18 + uVar16] - dVar1;
      uVar16 = uVar16 + 1;
      pdVar12 = pdVar12 + 1;
    } while ((double *)uVar16 != local_40);
  }
  lVar18 = lVar17 * 8 + 0x10;
  pdVar12 = (double *)malloc(lVar15 * lVar18);
  local_40 = pdVar12;
  memcpy(pdVar12,x_00,__size_00);
  memcpy(pdVar12 + (int)(uVar2 * iVar4),__src,__size_01);
  memcpy(pdVar12 + iVar5 * iVar4,_iStack_48,__size_01);
  free(pdVar6);
  free(pdVar7);
  obj_00 = reg_init(iVar4,(int)(lVar17 + 2));
  setIntercept(obj_00,0);
  pdVar7 = (double *)malloc((lVar17 + 2) * lVar18);
  pdVar12 = (double *)malloc(__size_01);
  pdVar6 = local_40;
  regress(obj_00,local_40,oup_00 + (uint)mlags,pdVar12,pdVar7,0.95);
  free(oup);
  free(pdVar7);
  free(__ptr);
  free(x_00);
  free(pdVar12);
  free_reg(obj);
  free(__ptr_00);
  free(pdVar10);
  free((void *)var[1]);
  free(pdVar8);
  free(pdVar9);
  free(__src);
  free(_iStack_48);
  free(pdVar6);
  return obj_00;
}

Assistant:

reg_object fitOCSB(double *x, int N, int f, int lag, int mlags) {
    int i,j,Nyf,Ny, ylrows, ylcols,p;
    double *y_fdiff, *y, *ylag, *mf, *res, *varcovar;
    double *z4_y,*z4_lag,*z4_preds,*z4,*inp,*z5_y,*z5_lag,*z5_preds,*z5,*XX;
    double *y2,*z5_y2;
    int Nz4y,Nz5y,mfrows;
    double alpha;
    reg_object fit;
    reg_object fitout;

    y_fdiff = (double*)malloc(sizeof(double)*N);
    y = (double*)malloc(sizeof(double)*N);
    double var[2] = {0,0};

    Nyf = diffs(x,N,1,f,y_fdiff);
    Ny = diff(y_fdiff,Nyf,1,y);

    //mdisplay(y_fdiff,1,Nyf);
    //mdisplay(y,1,Ny);

    ylag = genLags(y,Ny,lag,&ylrows,&ylcols);

    //mdisplay(ylag,ylrows,ylcols);

    if (mlags > -1) {
        y2 = &y[mlags];
        Ny -= mlags;
    }

    //mdisplay(y,1,Ny);

    mf = (double*) malloc(sizeof(double)*ylrows*Ny);
    mfrows = ylrows;

    for(i = 0; i < ylrows;++i) {
        memcpy(mf+Ny*i,ylag+ylcols*i,sizeof(double)*Ny);
    }

    //mdisplay(mf,ylrows,Ny);

    p = ylrows + 1;
    varcovar = (double*)malloc(sizeof(double)*p*p);
    res = (double*)malloc(sizeof(double)*Ny);
    alpha = 0.95;
    fit = reg_init(Ny,p);

    regress(fit,mf,y2,res,varcovar,alpha);

    //summary(fit);
    //printf("loglik %g aic %g bic %g aicc %g \n",fit->loglik,fit->aic,fit->bic,fit->aicc);

    z4_y = &y_fdiff[lag];
    Nz4y = Nyf - lag;
    //mdisplay(z4_y,1,Nz4y);

    z4_lag = genLags(y_fdiff,Nyf,lag,&ylrows,&ylcols);

    //mdisplay(z4_lag,ylrows,ylcols);

    inp = (double*) malloc(sizeof(double)*ylcols);
    z4_preds = (double*) malloc(sizeof(double)*Nz4y);
    z4 = (double*) malloc(sizeof(double)*Nz4y);

    //printf("nz4y %d ylrows %d ylcols %d",Nz4y,ylrows,ylcols);

    for(i = 0; i < Nz4y;++i) {
        for(j = 0; j < ylrows;++j) {
            inp[j] = z4_lag[j*ylcols+i];
        }

        z4_preds[i] = fitted(fit,inp,varcovar,var);
        z4[i] = z4_y[i] - z4_preds[i];
    }

    free(inp);

    //mdisplay(z4_preds,1,Nz4y);

    z5_y = (double*)malloc(sizeof(double)*N);

    Nz5y = diff(x,N,1,z5_y);

    z5_lag = genLags(z5_y,Nz5y,lag,&ylrows,&ylcols);

    z5_y2 = &z5_y[lag];
    Nz5y -= lag;

    inp = (double*) malloc(sizeof(double)*ylcols);
    z5_preds = (double*) malloc(sizeof(double)*Nz5y);
    z5 = (double*) malloc(sizeof(double)*Nz5y);

    for(i = 0; i < Nz5y;++i) {
        for(j = 0; j < ylrows;++j) {
            inp[j] = z5_lag[j*ylcols+i];
        }

        z5_preds[i] = fitted(fit,inp,varcovar,var);
        z5[i] = z5_y2[i] - z5_preds[i];
    }

    //mdisplay(z5_preds,1,Nz5y);

    XX = (double*) malloc(sizeof(double)*(mfrows+2) * Ny);
    memcpy(XX,mf,sizeof(double)*mfrows*Ny);
    memcpy(XX+mfrows*Ny,z4,sizeof(double)*Ny);
    memcpy(XX+(mfrows+1)*Ny,z5,sizeof(double)*Ny);

    //mdisplay(XX,mfrows+2,Ny);
    //mdisplay(y,1,Ny);

    free(varcovar);
    free(res);

    p = mfrows+2;

    fitout = reg_init(Ny,p);
    setIntercept(fitout,0);

    varcovar = (double*)malloc(sizeof(double)*p*p);
    res = (double*)malloc(sizeof(double)*Ny);

    regress(fitout,XX,y2,res,varcovar,alpha);

	
    free(y_fdiff);
    free(varcovar);
    free(ylag);
    free(mf);
    free(res);
    free_reg(fit);
    free(z4_lag);
    free(inp);
    free(z4_preds);
    free(y);
    free(z5_y);
    free(z5_lag);
    free(z4);
    free(z5);
    free(z5_preds);
    free(XX);
 

    return fitout;
}